

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_map.hpp
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>,_bool>
 __thiscall
itlib::
flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
::emplace<char_const(&)[9],Rml::Variant>
          (flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
           *this,char (*args) [9],Variant *args_1)

{
  undefined8 extraout_RDX;
  pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>,_bool>
  pVar1;
  undefined1 local_78 [8];
  value_type val;
  Variant *args_local_1;
  char (*args_local) [9];
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  *this_local;
  
  val.second.data._24_8_ = args_1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  ::pair<const_char_(&)[9],_Rml::Variant,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
              *)local_78,args,args_1);
  pVar1 = insert<std::pair<std::__cxx11::string,Rml::Variant>>
                    (this,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
                           *)local_78);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
           *)local_78);
  pVar1._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  return pVar1;
}

Assistant:

std::pair<iterator, bool> emplace(Args&&... args)
    {
        value_type val(std::forward<Args>(args)...);
        return insert(std::move(val));
    }